

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cc
# Opt level: O2

void __thiscall
gvr::Mesh::Mesh(Mesh *this,Mesh *p,vector<bool,_std::allocator<bool>_> *vused,
               vector<bool,_std::allocator<bool>_> *tused)

{
  uint uVar1;
  float *pfVar2;
  uint *puVar3;
  const_reference cVar4;
  long lVar5;
  float *pfVar6;
  uint *puVar7;
  uint uVar8;
  ulong uVar9;
  size_type __new_size;
  ulong uVar10;
  int i_2;
  int i;
  size_type sVar11;
  vector<unsigned_int,_std::allocator<unsigned_int>_> index;
  
  PointCloud::PointCloud(&this->super_PointCloud,&p->super_PointCloud,vused);
  (this->super_PointCloud).super_Model._vptr_Model = (_func_int **)&PTR__Mesh_001731d8;
  lVar5 = (long)(this->super_PointCloud).n;
  uVar9 = lVar5 * 0xc;
  if (lVar5 < 0) {
    uVar9 = 0xffffffffffffffff;
  }
  pfVar6 = (float *)operator_new__(uVar9);
  this->normal = pfVar6;
  lVar5 = 8;
  uVar8 = 0;
  for (sVar11 = 0; __new_size = (size_type)(p->super_PointCloud).n, (long)sVar11 < (long)__new_size;
      sVar11 = sVar11 + 1) {
    cVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](vused,sVar11);
    if (cVar4) {
      pfVar6 = p->normal;
      pfVar2 = this->normal;
      pfVar2[uVar8] = *(float *)((long)pfVar6 + lVar5 + -8);
      uVar1 = uVar8 + 2;
      pfVar2[uVar8 + 1] = *(float *)((long)pfVar6 + lVar5 + -4);
      uVar8 = uVar8 + 3;
      pfVar2[uVar1] = *(float *)((long)pfVar6 + lVar5);
    }
    lVar5 = lVar5 + 0xc;
  }
  index.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  index.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  index.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&index,__new_size);
  uVar8 = 0;
  for (sVar11 = 0; (long)sVar11 < (long)(p->super_PointCloud).n; sVar11 = sVar11 + 1) {
    cVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](vused,sVar11);
    if (cVar4) {
      index.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[sVar11] = uVar8;
      uVar8 = uVar8 + 1;
    }
  }
  this->n = 0;
  for (sVar11 = 0; uVar9 = (ulong)p->n, (long)sVar11 < (long)uVar9; sVar11 = sVar11 + 1) {
    cVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](tused,sVar11);
    if (cVar4) {
      this->n = this->n + 1;
    }
  }
  uVar10 = (long)this->n * 0xc;
  if ((long)this->n < 0) {
    uVar10 = 0xffffffffffffffff;
  }
  puVar7 = (uint *)operator_new__(uVar10);
  this->triangle = puVar7;
  lVar5 = 8;
  uVar8 = 0;
  for (sVar11 = 0; (long)sVar11 < (long)(int)uVar9; sVar11 = sVar11 + 1) {
    cVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](tused,sVar11);
    if (cVar4) {
      puVar7 = p->triangle;
      puVar3 = this->triangle;
      puVar3[uVar8] =
           index.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start[*(uint *)((long)puVar7 + lVar5 + -8)];
      uVar1 = uVar8 + 2;
      puVar3[uVar8 + 1] =
           index.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start[*(uint *)((long)puVar7 + lVar5 + -4)];
      uVar8 = uVar8 + 3;
      puVar3[uVar1] =
           index.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start[*(uint *)((long)puVar7 + lVar5)];
    }
    uVar9 = (ulong)(uint)p->n;
    lVar5 = lVar5 + 0xc;
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&index.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return;
}

Assistant:

Mesh::Mesh(const Mesh &p, const std::vector<bool> &vused, const std::vector<bool> &tused)
  : PointCloud(p, vused)
{
  normal=new float [3*getVertexCount()];

  unsigned int k=0;

  for (int i=0; i<p.getVertexCount(); i++)
  {
    if (vused[i])
    {
      normal[k++]=p.getNormalComp(i, 0);
      normal[k++]=p.getNormalComp(i, 1);
      normal[k++]=p.getNormalComp(i, 2);
    }
  }

  // adapt indices of triangle vertices

  std::vector<unsigned int> index;
  index.resize(p.getVertexCount());

  k=0;

  for (int i=0; i<p.getVertexCount(); i++)
  {
    if (vused[i])
    {
      index[i]=k++;
    }
  }

  n=0;

  for (int i=0; i<p.getTriangleCount(); i++)
    if (tused[i])
    {
      n++;
    }

  triangle=new unsigned int [3*n];

  k=0;

  for (int i=0; i<p.getTriangleCount(); i++)
  {
    if (tused[i])
    {
      triangle[k++]=index[p.getTriangleIndex(i, 0)];
      triangle[k++]=index[p.getTriangleIndex(i, 1)];
      triangle[k++]=index[p.getTriangleIndex(i, 2)];
    }
  }
}